

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

void __thiscall sentencepiece::unigram::Model::PopulateNodes(Model *this,Lattice *lattice)

{
  value_type_conflict1 vVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  size_type sVar6;
  ostream *poVar7;
  reference pvVar8;
  Node *pNVar9;
  Model *in_RDI;
  Node *node_1;
  Node *node;
  int id;
  int length;
  size_t k;
  bool has_single_node;
  size_t num_nodes;
  char *begin;
  int begin_pos;
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  trie_results;
  char *end;
  int len;
  float unk_score;
  anon_class_8_1_809a3e96 get_chars_length;
  Node *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  double in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  size_type in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  char *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  result_pair_type *in_stack_fffffffffffffee8;
  ostream *in_stack_fffffffffffffef0;
  DoubleArrayImpl<void,_void,_int,_void> *in_stack_fffffffffffffef8;
  size_type local_78;
  Die local_69;
  size_t local_68;
  char *local_60;
  int local_58;
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  local_40;
  char *local_28;
  int local_20;
  float local_1c;
  undefined1 *local_18;
  undefined1 local_10 [16];
  
  local_18 = local_10;
  local_1c = min_score(in_RDI);
  local_1c = local_1c + -10.0;
  local_20 = Lattice::size((Lattice *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
  ;
  pcVar4 = Lattice::sentence((Lattice *)0x481922);
  iVar3 = Lattice::utf8_size((Lattice *)0x481937);
  local_28 = pcVar4 + iVar3;
  std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>::allocator
            ((allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type> *)0x48197e)
  ;
  std::
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  ::vector((vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
            *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
           in_stack_fffffffffffffec8,
           (allocator_type *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>::~allocator
            ((allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type> *)0x4819aa)
  ;
  for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
    local_60 = Lattice::surface((Lattice *)
                                CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    std::
    unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
    ::operator->((unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                  *)0x4819f9);
    std::
    vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
    ::data((vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
            *)0x481a26);
    std::
    vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
    ::size(&local_40);
    sVar5 = Darts::DoubleArrayImpl<void,void,int,void>::
            commonPrefixSearch<Darts::DoubleArrayImpl<void,void,int,void>::result_pair_type>
                      (in_stack_fffffffffffffef8,(key_type *)in_stack_fffffffffffffef0,
                       in_stack_fffffffffffffee8,
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (size_t)in_stack_fffffffffffffed8,
                       CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    local_68 = sVar5;
    sVar6 = std::
            vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
            ::size(&local_40);
    if (sVar6 <= sVar5) {
      error::Die::Die(&local_69,true);
      pcVar4 = logging::BaseName((char *)in_stack_fffffffffffffea8);
      poVar7 = std::operator<<((ostream *)&std::cerr,pcVar4);
      poVar7 = std::operator<<(poVar7,"(");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x23a);
      in_stack_fffffffffffffef8 =
           (DoubleArrayImpl<void,_void,_int,_void> *)std::operator<<(poVar7,") [");
      in_stack_fffffffffffffef0 =
           std::operator<<((ostream *)in_stack_fffffffffffffef8,
                           "(num_nodes) < (trie_results.size())");
      in_stack_fffffffffffffee8 =
           (result_pair_type *)std::operator<<(in_stack_fffffffffffffef0,"] ");
      error::Die::operator&(&local_69,(ostream *)in_stack_fffffffffffffee8);
      error::Die::~Die((Die *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    }
    bVar2 = false;
    for (local_78 = 0; local_78 < local_68; local_78 = local_78 + 1) {
      in_stack_fffffffffffffed8 = local_60;
      in_stack_fffffffffffffee0 = local_58;
      std::
      vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
      ::operator[](&local_40,local_78);
      iVar3 = PopulateNodes::anon_class_8_1_809a3e96::operator()
                        ((anon_class_8_1_809a3e96 *)
                         CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                         (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      in_stack_fffffffffffffee4 = iVar3;
      pvVar8 = std::
               vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
               ::operator[](&local_40,local_78);
      vVar1 = pvVar8->value;
      in_stack_fffffffffffffed7 =
           ModelInterface::IsUnusedInlined
                     ((ModelInterface *)
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      if (!(bool)in_stack_fffffffffffffed7) {
        pNVar9 = Lattice::Insert((Lattice *)
                                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                                 (int)in_stack_fffffffffffffed8);
        pNVar9->id = vVar1;
        in_stack_fffffffffffffec7 =
             ModelInterface::IsUserDefinedInlined
                       ((ModelInterface *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        if ((bool)in_stack_fffffffffffffec7) {
          in_stack_fffffffffffffeb8 = (double)((float)iVar3 * in_RDI->max_score_) - 0.1;
        }
        else {
          in_stack_fffffffffffffeb4 =
               ModelInterface::GetScoreInlined
                         ((ModelInterface *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
          in_stack_fffffffffffffeb8 = (double)in_stack_fffffffffffffeb4;
        }
        pNVar9->score = (float)in_stack_fffffffffffffeb8;
        if ((!bVar2) && (pNVar9->length == 1)) {
          bVar2 = true;
        }
      }
    }
    if (!bVar2) {
      in_stack_fffffffffffffea8 =
           Lattice::Insert((Lattice *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                           (int)in_stack_fffffffffffffed8);
      in_stack_fffffffffffffea8->id = (in_RDI->super_ModelInterface).unk_id_;
      in_stack_fffffffffffffea8->score = local_1c;
    }
  }
  std::
  vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
  ::~vector((vector<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type,_std::allocator<Darts::DoubleArrayImpl<void,_void,_int,_void>::result_pair_type>_>
             *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  return;
}

Assistant:

void Model::PopulateNodes(Lattice *lattice) const {
  auto get_chars_length = [&lattice](int begin_pos, const char *end) {
    int pos = begin_pos;
    while (lattice->surface(pos) < end) ++pos;
    return pos - begin_pos;
  };

  const float unk_score = min_score() - kUnkPenalty;

  const int len = lattice->size();
  const char *end = lattice->sentence() + lattice->utf8_size();

  // +1 just in case.
  std::vector<Darts::DoubleArray::result_pair_type> trie_results(
      trie_results_size_ + 1);

  for (int begin_pos = 0; begin_pos < len; ++begin_pos) {
    const char *begin = lattice->surface(begin_pos);

    // Finds all pieces which are prefix of surface(begin_pos).
    const size_t num_nodes = trie_->commonPrefixSearch(
        begin, trie_results.data(), trie_results.size(),
        static_cast<int>(end - begin));
    CHECK_LT(num_nodes, trie_results.size());

    bool has_single_node = false;

    // Inserts pieces to the lattice.
    for (size_t k = 0; k < num_nodes; ++k) {
      const int length =
          get_chars_length(begin_pos, begin + trie_results[k].length);
      const int id = trie_results[k].value;
      if (IsUnusedInlined(id)) continue;
      Lattice::Node *node = lattice->Insert(begin_pos, length);
      node->id = id;  // the value of Trie stores vocab_id.
      // User defined symbol receives extra bonus to always be selected.
      node->score = IsUserDefinedInlined(id) ? (length * max_score_ - 0.1)
                                             : GetScoreInlined(id);
      if (!has_single_node && node->length == 1) {
        has_single_node = true;
      }
    }

    if (!has_single_node) {
      Lattice::Node *node = lattice->Insert(begin_pos, 1);
      node->id = unk_id_;  // add UNK node.
      node->score = unk_score;
    }
  }
}